

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cb.cpp
# Opt level: O2

void ucnv_cbToUWriteSub_63(UConverterToUnicodeArgs *args,int32_t offsetIndex,UErrorCode *err)

{
  UChar *source;
  
  if ((args->converter->invalidCharLength == '\x01') && (args->converter->subChar1 != '\0')) {
    source = &ucnv_cbToUWriteSub_63::kSubstituteChar1;
  }
  else {
    source = &ucnv_cbToUWriteSub_63::kSubstituteChar;
  }
  ucnv_cbToUWriteUChars_63(args,source,1,offsetIndex,err);
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_cbToUWriteSub (UConverterToUnicodeArgs *args,
                         int32_t offsetIndex,
                       UErrorCode * err)
{
    static const UChar kSubstituteChar1 = 0x1A, kSubstituteChar = 0xFFFD;

    /* could optimize this case, just one uchar */
    if(args->converter->invalidCharLength == 1 && args->converter->subChar1 != 0) {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar1, 1, offsetIndex, err);
    } else {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar, 1, offsetIndex, err);
    }
}